

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

void remove_from_bucket(ecs_bucket_t *bucket,ecs_size_t elem_size,ecs_map_key_t key,int32_t index)

{
  int iVar1;
  ecs_map_key_t *peVar2;
  
  _ecs_assert(bucket->count != 0,0xc,(char *)0x0,"bucket->count != 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/map.c"
              ,0x99);
  if (bucket->count == 0) {
    __assert_fail("bucket->count != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/map.c"
                  ,0x99,
                  "void remove_from_bucket(ecs_bucket_t *, ecs_size_t, ecs_map_key_t, int32_t)");
  }
  _ecs_assert(index < bucket->count,0xc,(char *)0x0,"index < bucket->count",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/map.c"
              ,0x9a);
  iVar1 = bucket->count;
  if (iVar1 <= index) {
    __assert_fail("index < bucket->count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/map.c"
                  ,0x9a,
                  "void remove_from_bucket(ecs_bucket_t *, ecs_size_t, ecs_map_key_t, int32_t)");
  }
  bucket->count = iVar1 + -1;
  if (iVar1 + -1 == index) {
    return;
  }
  _ecs_assert(bucket->keys[index] == key,0xc,(char *)0x0,"key == bucket->keys[index]",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/map.c"
              ,0x9f);
  peVar2 = bucket->keys;
  if (peVar2[index] == key) {
    peVar2[index] = peVar2[(long)iVar1 + -1];
    memcpy((void *)((long)(index * elem_size) + (long)bucket->payload),
           (void *)((long)bucket->count * (long)elem_size + (long)bucket->payload),(long)elem_size);
    return;
  }
  __assert_fail("key == bucket->keys[index]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/map.c"
                ,0x9f,"void remove_from_bucket(ecs_bucket_t *, ecs_size_t, ecs_map_key_t, int32_t)")
  ;
}

Assistant:

static
void remove_from_bucket(
    ecs_bucket_t *bucket,
    ecs_size_t elem_size,
    ecs_map_key_t key,
    int32_t index)
{
    (void)key;

    ecs_assert(bucket->count != 0, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(index < bucket->count, ECS_INTERNAL_ERROR, NULL);
    
    int32_t bucket_count = -- bucket->count;

    if (index != bucket->count) {
        ecs_assert(key == bucket->keys[index], ECS_INTERNAL_ERROR, NULL);
        bucket->keys[index] = bucket->keys[bucket_count];

        ecs_map_key_t *elem = GET_ELEM(bucket->payload, elem_size, index);
        ecs_map_key_t *last_elem = GET_ELEM(bucket->payload, elem_size, bucket->count);

        ecs_os_memcpy(elem, last_elem, elem_size);
    }
}